

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_wrapper2.cpp
# Opt level: O2

void test_cpp_wrapper_all_records
               (planck_unit_test_t *tc,Dictionary<int,_int> *dict,int random_positive_num)

{
  undefined8 uVar1;
  long lVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  undefined8 uStack_40;
  int aiStack_38 [2];
  
  lVar2 = -((ulong)(uint)random_positive_num * 4 + 0xf & 0xfffffffffffffff0);
  uVar5 = 0;
  aiStack_38[1] = random_positive_num;
  uVar3 = 0;
  if (0 < random_positive_num) {
    uVar3 = (ulong)(uint)random_positive_num;
  }
  for (; uVar3 != uVar5; uVar5 = uVar5 + 1) {
    iVar4 = (int)uVar5;
    *(undefined8 *)((long)&uStack_40 + lVar2) = 1;
    uVar1 = *(undefined8 *)((long)&uStack_40 + lVar2);
    *(undefined8 *)((long)&uStack_40 + lVar2) = 0x1082bd;
    cpp_wrapper_insert(tc,dict,iVar4,iVar4,(ion_boolean_t)uVar1);
    ((int *)((long)aiStack_38 + lVar2))[uVar5] = iVar4;
  }
  *(undefined8 *)((long)&uStack_40 + lVar2) = 1;
  iVar4 = aiStack_38[1];
  uVar1 = *(undefined8 *)((long)&uStack_40 + lVar2);
  *(undefined8 *)((long)&uStack_40 + lVar2) = 0x1082db;
  cpp_wrapper_all_records(tc,dict,(int *)((long)aiStack_38 + lVar2),iVar4,(ion_boolean_t)uVar1);
  return;
}

Assistant:

void
test_cpp_wrapper_all_records(
	planck_unit_test_t *tc,
	Dictionary<int, int> *dict,
	int random_positive_num
) {
	int records[random_positive_num];

	for (int i = 0; i < random_positive_num; i++) {
		cpp_wrapper_insert(tc, dict, i, i, boolean_true);
		records[i] = i;
	}

	cpp_wrapper_all_records(tc, dict, records, random_positive_num, boolean_true);
}